

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JtagTypes.cpp
# Opt level: O2

string * __thiscall
JtagShiftedData::GetASCIIString_abi_cxx11_
          (string *__return_storage_ptr__,JtagShiftedData *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *bits)

{
  pointer puVar1;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Var2;
  long lVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *bits_00;
  ulonglong uVar4;
  char number_str [32];
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  number_str[0] = '\x01';
  number_str[1] = '\0';
  number_str[2] = '\0';
  number_str[3] = '\0';
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__ops::_Iter_equals_val<BitState_const>>
                    (this->mStartSampleIndex,
                     (this->mTdiBits).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start);
  puVar1 = (this->mTdiBits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  bits_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
            (puVar1 + -(long)_Var2._M_current);
  if ((long)bits_00 < 9) {
    uVar4 = 0;
    for (lVar3 = -8; lVar3 != 0; lVar3 = lVar3 + 1) {
      uVar4 = (ulong)(puVar1[lVar3] == '\x01') + uVar4 * 2;
    }
    AnalyzerHelpers::GetNumberString(uVar4,ASCII,8,number_str,0x20);
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
  }
  else {
    GetDecimalString_abi_cxx11_(&local_50,this,bits_00);
    std::operator+(&local_30,'\'',&local_50);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)number_str,
                   &local_30,'\'');
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)number_str);
    std::__cxx11::string::~string((string *)number_str);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string JtagShiftedData::GetASCIIString( const std::vector<U8>& bits )
{
    std::string ret_val;

    // Check if the value of the number represented by bits is less than 0x100.
    // If it is, we can make an ASCII out of it, otherwise use GetDecimalString()
    std::vector<U8>::const_iterator srch_hi( std::find( bits.begin(), bits.end(), BIT_HIGH ) );
    if( bits.end() - srch_hi <= 8 )
    {
        // Get the numerical value from the bits.
        U64 val;

        // Only get the 8 least significant bits
        std::vector<U8>::const_iterator bsi( bits.end() - 8 );
        for( val = 0; bsi != bits.end(); ++bsi )
            val = ( val << 1 ) | ( *bsi == BIT_HIGH ? 1 : 0 );

        // make a string out of that value
        char number_str[ 32 ];
        AnalyzerHelpers::GetNumberString( val, ASCII, 8, number_str, sizeof( number_str ) );

        ret_val = number_str;
    }
    else
    {
        ret_val = '\'' + GetDecimalString( bits ) + '\'';
    }

    return ret_val;
}